

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_gen.c
# Opt level: O2

iogen_oprnd *
gen_size_conversion(iogen_oprnd *__return_storage_ptr__,dill_stream c,iogen_oprnd src_oprnd,int size
                   )

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  jmp_table pjVar4;
  char *pcVar5;
  int iVar6;
  dill_reg *pdVar7;
  int iStack_40;
  dill_reg at;
  
  __return_storage_ptr__->vc_reg = (int)src_oprnd._32_8_;
  __return_storage_ptr__->vc_reg2 = (int)((ulong)src_oprnd._32_8_ >> 0x20);
  uVar1 = src_oprnd._0_8_;
  uVar2 = src_oprnd._8_8_;
  __return_storage_ptr__->offset = src_oprnd.offset;
  __return_storage_ptr__->aligned = src_oprnd.aligned;
  __return_storage_ptr__->byte_swap = src_oprnd.byte_swap;
  __return_storage_ptr__->address = (int)uVar1;
  __return_storage_ptr__->data_type = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&__return_storage_ptr__->size = uVar2;
  __return_storage_ptr__->size = size;
  if (boolean_type < src_oprnd.data_type) {
    return __return_storage_ptr__;
  }
  if ((0xd4U >> (src_oprnd.data_type & 0x1f) & 1) == 0) {
    if (src_oprnd.data_type == integer_type) {
      switch(size) {
      case 1:
        iVar3 = ffs_getreg(c,&__return_storage_ptr__->vc_reg,0,1);
        if (iVar3 != 0) {
          if (src_oprnd.size == 8) goto LAB_00114363;
          if (src_oprnd.size != 4) goto LAB_001140fd;
          pjVar4 = c->j;
          iVar3 = __return_storage_ptr__->vc_reg;
          iVar6 = 4;
          goto LAB_00114370;
        }
        break;
      case 2:
        iVar3 = 2;
        goto LAB_00114231;
      default:
        goto switchD_001140c8_caseD_3;
      case 4:
        pdVar7 = &__return_storage_ptr__->vc_reg;
        iVar3 = ffs_getreg(c,pdVar7,4,1);
        if (iVar3 == 0) {
          pcVar5 = "gen size convert out of registers E\n";
          goto LAB_00114521;
        }
        if (src_oprnd.size == 8) {
          pjVar4 = c->j;
          iVar3 = *pdVar7;
          iVar6 = 6;
        }
        else {
          if (src_oprnd.size != 2) {
            if (src_oprnd.size != 1) {
              return __return_storage_ptr__;
            }
            pjVar4 = c->j;
            iVar3 = *pdVar7;
            iStack_40 = 4;
LAB_00114220:
            iVar6 = 0;
            goto LAB_001144b1;
          }
          pjVar4 = c->j;
          iVar3 = *pdVar7;
          iVar6 = 2;
        }
        iStack_40 = 4;
LAB_001144b1:
        (*pjVar4->convert)(c,iVar6,iStack_40,iVar3,src_oprnd.vc_reg);
switchD_001140c8_caseD_3:
        return __return_storage_ptr__;
      case 8:
        pdVar7 = &__return_storage_ptr__->vc_reg;
        iVar3 = ffs_getreg(c,pdVar7,6,1);
        if (iVar3 != 0) {
          if (src_oprnd.size == 4) {
            pjVar4 = c->j;
            iVar3 = *pdVar7;
            iVar6 = 4;
          }
          else {
            if (src_oprnd.size != 2) {
              if (src_oprnd.size != 1) {
                return __return_storage_ptr__;
              }
              pjVar4 = c->j;
              iVar3 = *pdVar7;
              iStack_40 = 6;
              goto LAB_00114220;
            }
            pjVar4 = c->j;
            iVar3 = *pdVar7;
            iVar6 = 2;
          }
          iStack_40 = 6;
          goto LAB_001144b1;
        }
      }
    }
    else {
      if (src_oprnd.data_type != float_type) {
        return __return_storage_ptr__;
      }
      pdVar7 = &__return_storage_ptr__->vc_reg;
      if ((size == 8) || (size != 4)) {
        iVar3 = ffs_getreg(c,pdVar7,10,1);
        if (iVar3 != 0) {
          if (src_oprnd.size != 4) {
            return __return_storage_ptr__;
          }
          pjVar4 = c->j;
          iVar3 = *pdVar7;
          iVar6 = 9;
          iStack_40 = 10;
          goto LAB_001144b1;
        }
      }
      else {
        iVar3 = ffs_getreg(c,pdVar7,9,1);
        if (iVar3 != 0) {
          if (src_oprnd.size != 8) {
            return __return_storage_ptr__;
          }
          pjVar4 = c->j;
          iVar3 = *pdVar7;
          iVar6 = 10;
          iStack_40 = 9;
          goto LAB_001144b1;
        }
      }
    }
  }
  else {
    switch(size) {
    case 1:
      iVar3 = ffs_getreg(c,&__return_storage_ptr__->vc_reg,1,1);
      if (iVar3 != 0) {
        if (src_oprnd.size == 8) {
LAB_00114363:
          pjVar4 = c->j;
          iVar3 = __return_storage_ptr__->vc_reg;
          iVar6 = 6;
LAB_00114370:
          iStack_40 = 0;
        }
        else {
          if (src_oprnd.size == 4) {
            pjVar4 = c->j;
            iVar3 = __return_storage_ptr__->vc_reg;
            iStack_40 = 4;
          }
          else {
LAB_001140fd:
            if (src_oprnd.size != 2) {
              return __return_storage_ptr__;
            }
            pjVar4 = c->j;
            iVar3 = __return_storage_ptr__->vc_reg;
            iStack_40 = 2;
          }
          (*pjVar4->convert)(c,iStack_40,6,iVar3,src_oprnd.vc_reg);
          pjVar4 = c->j;
          iVar3 = __return_storage_ptr__->vc_reg;
          iVar6 = 6;
          iStack_40 = 0;
        }
        goto LAB_001144b1;
      }
      break;
    case 2:
      iVar3 = 3;
LAB_00114231:
      pdVar7 = &__return_storage_ptr__->vc_reg;
      iVar3 = ffs_getreg(c,pdVar7,iVar3,1);
      if (iVar3 != 0) {
        if (src_oprnd.size == 8) {
          pjVar4 = c->j;
          iVar3 = *pdVar7;
          iVar6 = 6;
        }
        else {
          if (src_oprnd.size != 4) {
            if (src_oprnd.size != 1) {
              return __return_storage_ptr__;
            }
            iVar3 = ffs_getreg(c,&at,6,1);
            if (iVar3 != 0) {
              (*c->j->convert)(c,0,6,at,src_oprnd.vc_reg);
              (*c->j->convert)(c,6,2,*pdVar7,at);
              ffs_putreg(c,at,6);
              return __return_storage_ptr__;
            }
            pcVar5 = "gen type convert2 out of registers \n";
            goto LAB_00114521;
          }
          pjVar4 = c->j;
          iVar3 = *pdVar7;
          iVar6 = 4;
        }
        iStack_40 = 2;
        goto LAB_001144b1;
      }
      break;
    default:
      goto switchD_001140c8_caseD_3;
    case 4:
      pdVar7 = &__return_storage_ptr__->vc_reg;
      iVar3 = ffs_getreg(c,pdVar7,5,1);
      if (iVar3 != 0) {
        if (src_oprnd.size == 8) {
          pjVar4 = c->j;
          iVar3 = *pdVar7;
          iVar6 = 6;
        }
        else {
          if (src_oprnd.size != 2) {
            if (src_oprnd.size != 1) {
              return __return_storage_ptr__;
            }
            pjVar4 = c->j;
            iVar3 = *pdVar7;
            iStack_40 = 5;
            goto LAB_00114220;
          }
          pjVar4 = c->j;
          iVar3 = *pdVar7;
          iVar6 = 2;
        }
        iStack_40 = 5;
        goto LAB_001144b1;
      }
      break;
    case 8:
      pdVar7 = &__return_storage_ptr__->vc_reg;
      iVar3 = ffs_getreg(c,pdVar7,7,1);
      if (iVar3 != 0) {
        if (src_oprnd.size == 4) {
          pjVar4 = c->j;
          iVar3 = *pdVar7;
          iVar6 = 5;
        }
        else if (src_oprnd.size == 2) {
          pjVar4 = c->j;
          iVar3 = *pdVar7;
          iVar6 = 3;
        }
        else {
          if (src_oprnd.size != 1) {
            return __return_storage_ptr__;
          }
          pjVar4 = c->j;
          iVar3 = *pdVar7;
          iVar6 = 1;
        }
        iStack_40 = 7;
        goto LAB_001144b1;
      }
    }
  }
  pcVar5 = "gen size convert out of registers \n";
LAB_00114521:
  fprintf(_stderr,"%s\n",pcVar5);
  exit(0);
}

Assistant:

iogen_oprnd
gen_size_conversion(dill_stream c, iogen_oprnd src_oprnd, int size)
{
    iogen_oprnd result_oprnd = src_oprnd;
    dill_reg at;  /* temporary */
    result_oprnd.size = size;
    switch (src_oprnd.data_type) {
    case integer_type:
	switch (size) {
	case 1:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_C, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 2:
		dill_cvs2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 2:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_S, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		if (!ffs_getreg(c, &at, DILL_L, DILL_TEMP))
		    gen_fatal("gen type convert2 out of registers \n");
		dill_cvc2l(c, at, src_oprnd.vc_reg);
		dill_cvl2s(c, result_oprnd.vc_reg, at);
		ffs_putreg(c, at, DILL_L);
		break;
	    case 4:
		dill_cvi2s(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2s(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 4:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_I, DILL_TEMP))
		gen_fatal("gen size convert out of registers E\n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2i(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2i(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2i(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 8:
#if SIZEOF_SIZE_T == 8
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_L, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
#else
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_L, DILL_TEMP) ||
		(!ffs_getreg(c, &result_oprnd.vc_reg2, DILL_L, DILL_TEMP)))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg2)));
	    dill_setl(c, result_oprnd.vc_reg2, 0);
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
#endif
	}
	break;
    case boolean_type:
    case enumeration_type:
    case unsigned_type:
    case char_type:
	switch (size) {
	case 1:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_UC, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 2:
		dill_cvs2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2l(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2c(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 2:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_US, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		if (!ffs_getreg(c, &at, DILL_L, DILL_TEMP))
		    gen_fatal("gen type convert2 out of registers \n");
		dill_cvc2l(c, at, src_oprnd.vc_reg);
		dill_cvl2s(c, result_oprnd.vc_reg, at);
		ffs_putreg(c, at, DILL_L);
		break;
	    case 4:
		dill_cvi2s(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2s(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 4:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_U, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2u(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2u(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 8:
		dill_cvl2u(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
	case 8:
#if SIZEOF_SIZE_T == 8
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_UL, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvuc2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvus2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvu2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
#else
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_UL, DILL_TEMP) ||
		!ffs_getreg(c, &result_oprnd.vc_reg2, DILL_UL, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg2)));
	    dill_setl(c, result_oprnd.vc_reg2, 0);
	    switch (src_oprnd.size) {
	    case 1:
		dill_cvc2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 2:
		dill_cvs2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    case 4:
		dill_cvi2ul(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    }
	    break;
#endif
	}
	break;
    case float_type:
	switch (size) {
	case SIZEOF_FLOAT:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_F, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case SIZEOF_FLOAT:
		assert(FALSE);
		break;
	    case SIZEOF_DOUBLE:
		dill_cvd2f(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    default:
		assert(FALSE);
	    }
	    break;
	case SIZEOF_DOUBLE:
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_D, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case SIZEOF_DOUBLE:
		assert(FALSE);
		break;
	    case SIZEOF_FLOAT:
		dill_cvf2d(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    default:
		assert(FALSE);
	    }
	    break;
	default:
	    /* really should fail */
	    if (!ffs_getreg(c, &result_oprnd.vc_reg, DILL_D, DILL_TEMP))
		gen_fatal("gen size convert out of registers \n");
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    REG_DEBUG(("get %d in size convert\n", _vrr(result_oprnd.vc_reg)));
	    switch (src_oprnd.size) {
	    case SIZEOF_DOUBLE:
/*		assert(FALSE);*/
		break;
	    case SIZEOF_FLOAT:
		dill_cvf2d(c, result_oprnd.vc_reg, src_oprnd.vc_reg);
		break;
	    default:
		assert(FALSE);
	    }
	    break;
	    
	}
	break;
    case unknown_type:
    default:
	assert(FALSE);
	break;
    }
    return result_oprnd;
}